

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

void __thiscall smf::Options::appendOptions(Options *this,string *strang)

{
  uint uVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  int i;
  long lVar10;
  string tempvalue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tempargv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tempargv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tempargv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tempargv.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tempvalue._M_dataplus._M_p = (pointer)&tempvalue.field_2;
  tempvalue._M_string_length = 0;
  tempvalue.field_2._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&tokens,100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&tempargv,100);
  std::__cxx11::string::reserve((ulong)&tempvalue);
  uVar1 = (uint)strang->_M_string_length;
  uVar7 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar7;
  }
  bVar3 = false;
  bVar4 = false;
  do {
    if (uVar6 == uVar7) {
      if (tempvalue._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&tokens,&tempvalue);
        tempvalue._M_string_length = 0;
        *tempvalue._M_dataplus._M_p = '\0';
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&tempargv,
                (long)tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5);
      lVar8 = 0;
      for (lVar10 = 0;
          lVar10 < (int)((ulong)((long)tempargv.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)tempargv.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5);
          lVar10 = lVar10 + 1) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&((tempargv.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8))
        ;
        lVar8 = lVar8 + 0x20;
      }
      appendOptions(this,&tempargv);
      std::__cxx11::string::~string((string *)&tempvalue);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tempargv);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      return;
    }
    pcVar2 = (strang->_M_dataplus)._M_p;
    cVar9 = (char)&tempvalue;
    if ((bVar3) || (pcVar2[uVar7] != '\"')) {
      if ((bVar4) || (((uVar7 == 0 || (pcVar2[uVar7] != '\'')) || (pcVar2[uVar7 - 1] == '\\'))))
      goto LAB_00117f68;
      if (bVar3) goto LAB_00117fc9;
      bVar4 = false;
      bVar3 = true;
    }
    else if ((uVar7 == 0) || (pcVar2[uVar7 - 1] == '\\')) {
LAB_00117f68:
      if (!bVar4 && !bVar3) {
        iVar5 = isspace((int)pcVar2[uVar7]);
        if (iVar5 != 0) {
          if (tempvalue._M_string_length != 0) {
            std::__cxx11::string::push_back(cVar9);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&tokens,&tempvalue);
            goto LAB_00117fe3;
          }
          goto LAB_00117ff0;
        }
      }
      std::__cxx11::string::push_back(cVar9);
    }
    else {
      if (!bVar4) {
        bVar3 = false;
        bVar4 = true;
        goto LAB_00117ff9;
      }
LAB_00117fc9:
      std::__cxx11::string::push_back(cVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&tokens,&tempvalue);
LAB_00117fe3:
      tempvalue._M_string_length = 0;
      *tempvalue._M_dataplus._M_p = '\0';
LAB_00117ff0:
      bVar3 = false;
      bVar4 = false;
    }
LAB_00117ff9:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Options::appendOptions(const std::string& strang) {
	int doublequote = 0;
	int singlequote = 0;

	std::vector<std::string> tokens;
	std::vector<std::string> tempargv;
	std::string tempvalue;

	tokens.reserve(100);
	tempargv.reserve(100);
	tempvalue.reserve(1000);

	char ch = '\0';

	int length = (int)strang.size();
	for (int i=0; i<length; i++) {

		if (!singlequote && (strang[i] == '"')) {
			if ((i>0) && (strang[i-1] != '\\')) {
				doublequote = !doublequote;
				if (doublequote == 0) {
					// finished a doublequote section of data, so store
					// even if it is the empty string
					ch = '\0';
					tempvalue += (ch);
					tokens.push_back(tempvalue);
					tempvalue.clear();
					continue;
				} else {
					// don't store the leading ":
					continue;
				}
			}
		} else if (!doublequote && (strang[i] == '\'')) {
			if ((i>0) && (strang[i-1] != '\\')) {
				singlequote = !singlequote;
				if (singlequote == 0) {
					// finished a singlequote section of data, so store
					// even if it is the empty string
					ch = '\0';
					tempvalue += ch;
					tokens.push_back(tempvalue);
					tempvalue.clear();
					continue;
				} else {
					// don't store the leading ":
					continue;
				}
			}
		}


		if ((!doublequote && !singlequote) && std::isspace(strang[i])) {
			if (tempvalue.size() > 0) {
				tempvalue += ch;
				tokens.push_back(tempvalue);
				tempvalue.clear();
			}
		} else {
			ch = strang[i];
			tempvalue += ch;
		}
	}
	if (tempvalue.size() > 0) {
		tokens.push_back(tempvalue);
		tempvalue.clear();
	}

	// now that the input string has been chopped up into pieces,
	// assemble the argv structure

	tempargv.reserve(tokens.size());
	for (int i=0; i<(int)tempargv.size(); i++) {
		tempargv[i] = tokens[i];
	}

	// now store the argv and argc data in opts:

	// now store the parsed command-line simulated tokens
	// for actual storage:
	appendOptions(tempargv);
}